

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkparse.c
# Opt level: O0

int mbedtls_pk_parse_keyfile(mbedtls_pk_context *ctx,char *path,char *pwd)

{
  uchar *key;
  uchar *keylen;
  uchar *pwd_00;
  char *pk;
  size_t pwdlen;
  uchar *local_40;
  uchar *buf;
  size_t n;
  uchar *puStack_28;
  int ret;
  char *pwd_local;
  char *path_local;
  mbedtls_pk_context *ctx_local;
  
  n._4_4_ = 0xffffff92;
  puStack_28 = (uchar *)pwd;
  pwd_local = path;
  path_local = (char *)ctx;
  n._4_4_ = mbedtls_pk_load_file(path,&local_40,(size_t *)&buf);
  pk = path_local;
  pwd_00 = puStack_28;
  keylen = buf;
  key = local_40;
  ctx_local._4_4_ = n._4_4_;
  if (n._4_4_ == 0) {
    if (puStack_28 == (uchar *)0x0) {
      n._4_4_ = mbedtls_pk_parse_key
                          ((mbedtls_pk_context *)path_local,local_40,(size_t)buf,(uchar *)0x0,0);
    }
    else {
      pwdlen = strlen((char *)puStack_28);
      n._4_4_ = mbedtls_pk_parse_key((mbedtls_pk_context *)pk,key,(size_t)keylen,pwd_00,pwdlen);
    }
    mbedtls_platform_zeroize(local_40,(size_t)buf);
    free(local_40);
    ctx_local._4_4_ = n._4_4_;
  }
  return ctx_local._4_4_;
}

Assistant:

int mbedtls_pk_parse_keyfile( mbedtls_pk_context *ctx,
                      const char *path, const char *pwd )
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    size_t n;
    unsigned char *buf;

    PK_VALIDATE_RET( ctx != NULL );
    PK_VALIDATE_RET( path != NULL );

    if( ( ret = mbedtls_pk_load_file( path, &buf, &n ) ) != 0 )
        return( ret );

    if( pwd == NULL )
        ret = mbedtls_pk_parse_key( ctx, buf, n, NULL, 0 );
    else
        ret = mbedtls_pk_parse_key( ctx, buf, n,
                (const unsigned char *) pwd, strlen( pwd ) );

    mbedtls_platform_zeroize( buf, n );
    mbedtls_free( buf );

    return( ret );
}